

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.h
# Opt level: O3

void __thiscall TestMetrics::TestMetrics(TestMetrics *this,int label,Metrics *metrics)

{
  pointer ppVar1;
  uint64_t uVar2;
  ulong uVar3;
  long lVar4;
  float *pfVar5;
  float *pfVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar2 = metrics->predicted;
  this->gold = metrics->gold;
  this->predicted = uVar2;
  this->predictedGold = metrics->predictedGold;
  this->label = label;
  ppVar1 = (metrics->scoreVsTrue).
           super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)(metrics->scoreVsTrue).
                super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1;
  uVar7 = (uint)(uVar3 >> 3);
  this->scoresLen = uVar7;
  if (uVar7 == 0) {
    this->predictedScores = (float *)0x0;
    this->goldScores = (float *)0x0;
  }
  else {
    lVar4 = uVar3 * 0x20000000;
    uVar8 = lVar4 >> 0x1e;
    uVar3 = 0xffffffffffffffff;
    if (-1 < lVar4) {
      uVar3 = uVar8;
    }
    pfVar5 = (float *)operator_new__(uVar3);
    this->predictedScores = pfVar5;
    uVar8 = uVar8 & 0xfffffffffffffffc;
    if ((int)uVar7 < 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pfVar6 = (float *)operator_new__(uVar8);
    this->goldScores = pfVar6;
    if (0 < (int)uVar7) {
      uVar3 = 0;
      do {
        pfVar5[uVar3] = ppVar1[uVar3].first;
        pfVar6[uVar3] = ppVar1[uVar3].second;
        uVar3 = uVar3 + 1;
      } while ((uVar7 & 0x7fffffff) != uVar3);
    }
  }
  return;
}

Assistant:

explicit TestMetrics(int label, Meter::Metrics& metrics)
    {
        gold = metrics.gold;
        predicted = metrics.predicted;
        predictedGold = metrics.predictedGold;
        this->label = label;

        scoresLen = metrics.scoreVsTrue.size();

        if (scoresLen == 0)
        {
            predictedScores = nullptr;
            goldScores = nullptr;

            return;
        }

        predictedScores = new float[scoresLen];
        goldScores = new float[scoresLen];

        for (int i = 0; i<scoresLen; ++i) {
            predictedScores[i] = metrics.scoreVsTrue[i].first;
            goldScores[i] = metrics.scoreVsTrue[i].second;
        }
    }